

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

size_t mspace_set_footprint_limit(mspace msp,size_t bytes)

{
  size_t sVar1;
  
  if (bytes == 0xffffffffffffffff) {
    sVar1 = 0;
  }
  else {
    sVar1 = -mparams.granularity & (bytes - 1) + mparams.granularity;
  }
  *(size_t *)((long)msp + 0x368) = sVar1;
  return sVar1;
}

Assistant:

size_t mspace_set_footprint_limit(mspace msp, size_t bytes) {
  size_t result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    if (bytes == 0)
      result = granularity_align(1); /* Use minimal size */
    if (bytes == MAX_SIZE_T)
      result = 0;                    /* disable */
    else
      result = granularity_align(bytes);
    ms->footprint_limit = result;
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}